

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
               (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *block,
               SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list,
               SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *tail)

{
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *local_30;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *tail_local;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }